

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cpp
# Opt level: O1

string * __thiscall
testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
          (string *__return_storage_ptr__,internal *this,AssertionResult *assertion_result,
          char *expression_text,char *actual_predicate_value,char *expected_predicate_value)

{
  ostream *poVar1;
  size_t sVar2;
  char *__s;
  Message msg;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  
  if (*(undefined8 **)(this + 8) == (undefined8 *)0x0) {
    __s = "";
  }
  else {
    __s = (char *)**(undefined8 **)(this + 8);
  }
  Message::Message((Message *)&local_38);
  poVar1 = (ostream *)(local_38.ptr_ + 0x10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Value of: ",10);
  if (assertion_result == (AssertionResult *)0x0) {
    sVar2 = 6;
    assertion_result = (AssertionResult *)"(null)";
  }
  else {
    sVar2 = strlen(&assertion_result->success_);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&assertion_result->success_,sVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n  Actual: ",0xb);
  if (expression_text == (char *)0x0) {
    sVar2 = 6;
    expression_text = "(null)";
  }
  else {
    sVar2 = strlen(expression_text);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,expression_text,sVar2);
  if (*__s != '\0') {
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," (",2);
    sVar2 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,__s,sVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,")",1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\nExpected: ",0xb);
  if (actual_predicate_value == (char *)0x0) {
    sVar2 = 6;
    actual_predicate_value = "(null)";
  }
  else {
    sVar2 = strlen(actual_predicate_value);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,actual_predicate_value,sVar2);
  StringStreamToString(__return_storage_ptr__,local_38.ptr_);
  if (local_38.ptr_ != (stringstream *)0x0) {
    (**(code **)(*(long *)local_38.ptr_ + 8))(local_38.ptr_);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GetBoolAssertionFailureMessage(
    const AssertionResult& assertion_result,
    const char* expression_text,
    const char* actual_predicate_value,
    const char* expected_predicate_value) {
  const char* actual_message = assertion_result.message();
  Message msg;
  msg << "Value of: " << expression_text
      << "\n  Actual: " << actual_predicate_value;
  if (actual_message[0] != '\0')
    msg << " (" << actual_message << ")";
  msg << "\nExpected: " << expected_predicate_value;
  return msg.GetString();
}